

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

bool __thiscall
senjo::PerftCommandHandle::Process
          (PerftCommandHandle *this,char *params,uint64_t *count,uint64_t *nodes,uint64_t *qnodes)

{
  ChessEngine *pCVar1;
  int iVar2;
  Output *pOVar3;
  char *pcVar4;
  bool bVar5;
  uint64_t local_e0;
  Output local_90;
  long local_88;
  uint64_t qnode_count;
  uint64_t node_count;
  uint64_t perft_count;
  unsigned_long local_68;
  uint64_t expected;
  Output local_50;
  int local_44;
  char *pcStack_40;
  int depth;
  char *p;
  uint64_t *qnodes_local;
  uint64_t *nodes_local;
  uint64_t *count_local;
  char *params_local;
  PerftCommandHandle *this_local;
  
  local_44 = 0;
  pcStack_40 = params + 1;
  p = (char *)qnodes;
  qnodes_local = nodes;
  nodes_local = count;
  count_local = (uint64_t *)params;
  params_local = (char *)this;
  while( true ) {
    bVar5 = false;
    if (*pcStack_40 != '\0') {
      iVar2 = isdigit((int)*pcStack_40);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    pcVar4 = pcStack_40 + 1;
    local_44 = local_44 * 10 + *pcStack_40 + -0x30;
    pcStack_40 = pcVar4;
    if (local_44 < 0) {
      Output::Output(&local_50,InfoPrefix);
      pOVar3 = Output::operator<<(&local_50,(char (*) [16])"invalid depth: ");
      Output::operator<<(pOVar3,(char **)&count_local);
      Output::~Output(&local_50);
      return true;
    }
  }
  if ((local_44 == 0) || ((this->maxDepth != 0 && (this->maxDepth < local_44)))) {
    return true;
  }
  NextWord(&stack0xffffffffffffffc0);
  local_68 = 0;
  while( true ) {
    bVar5 = false;
    if (*pcStack_40 != '\0') {
      iVar2 = isdigit((int)*pcStack_40);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    local_68 = local_68 * 10 + (long)(*pcStack_40 + -0x30);
    pcStack_40 = pcStack_40 + 1;
  }
  if ((local_68 == 0) || ((this->maxLeafs != 0 && (this->maxLeafs < local_68)))) {
    return true;
  }
  Output::Output((Output *)&perft_count,InfoPrefix);
  pOVar3 = Output::operator<<((Output *)&perft_count,(char (*) [5])"--- ");
  pOVar3 = Output::operator<<(pOVar3,&local_44);
  pOVar3 = Output::operator<<(pOVar3,(char (*) [5])" => ");
  Output::operator<<(pOVar3,&local_68);
  Output::~Output((Output *)&perft_count);
  if ((this->qperft & 1U) == 0) {
    local_e0 = ChessEngine::Perft((this->super_BackgroundCommand).engine,local_44);
  }
  else {
    local_e0 = ChessEngine::QPerft((this->super_BackgroundCommand).engine,local_44);
  }
  node_count = local_e0;
  qnode_count = 0;
  local_88 = 0;
  pCVar1 = (this->super_BackgroundCommand).engine;
  (*pCVar1->_vptr_ChessEngine[0x10])(pCVar1,0,0,&qnode_count,&local_88,0,0,0,0);
  *nodes_local = node_count + *nodes_local;
  *qnodes_local = qnode_count + *qnodes_local;
  *(long *)p = local_88 + *(long *)p;
  if (((this->qperft & 1U) == 0) && (node_count != local_68)) {
    Output::Output(&local_90,InfoPrefix);
    pOVar3 = Output::operator<<(&local_90,(char (*) [5])"--- ");
    pOVar3 = Output::operator<<(pOVar3,&node_count);
    pOVar3 = Output::operator<<(pOVar3,(char (*) [5])" != ");
    Output::operator<<(pOVar3,&local_68);
    Output::~Output(&local_90);
    return false;
  }
  return true;
}

Assistant:

bool PerftCommandHandle::Process(const char* params, uint64_t& count,
                                 uint64_t& nodes, uint64_t& qnodes)
{
  const char* p = (params + 1);
  int depth = 0;
  while (*p && isdigit(*p)) {
    depth = ((10 * depth) + (*p++ - '0'));
    if (depth < 0) {
      Output() << "invalid depth: " << params;
      return true;
    }
  }
  if (!depth || (maxDepth && (depth > maxDepth))) {
    return true;
  }

  NextWord(p);

  uint64_t expected = 0;
  while (*p && isdigit(*p)) {
    expected = ((10 * expected) + (*p++ - '0'));
  }
  if (!expected || (maxLeafs && (expected > maxLeafs))) {
    return true;
  }

  Output() << "--- " << depth << " => " << expected;
  uint64_t perft_count = qperft ? engine->QPerft(depth) : engine->Perft(depth);
  uint64_t node_count = 0;
  uint64_t qnode_count = 0;

  engine->GetStats(NULL, NULL, &node_count, &qnode_count);
  count += perft_count;
  nodes += node_count;
  qnodes += qnode_count;

  if (!qperft && (perft_count != expected)) {
    Output() << "--- " << perft_count << " != " << expected;
    return false;
  }

  return true;
}